

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_compress_symbolic.cpp
# Opt level: O0

bool realign_weights_undecimated
               (astcenc_profile decode_mode,block_size_descriptor *bsd,image_block *blk,
               symbolic_compressed_block *scb)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  uint uVar22;
  long in_RCX;
  image_block *in_RDX;
  long in_RSI;
  float fVar23;
  float fVar24;
  undefined8 uVar25;
  vfloat4 vVar26;
  float error_up;
  float error_down;
  float error_base;
  vfloat4 color_diff_up;
  vfloat4 color_diff_down;
  vfloat4 color_diff;
  vfloat4 error_weight;
  vfloat4 orig_color;
  vfloat4 color;
  vfloat4 color_base;
  vfloat4 color_offset;
  uint partition;
  float weight_up;
  float weight_down;
  float weight_base;
  int uqw_up;
  int uqw_down;
  uint32_t prev_and_next;
  int uqw;
  uint texel;
  vint4 epd;
  uint pa_idx_1;
  uint pl_idx;
  bool adjustments;
  uint8_t *dec_weights_uquant;
  uint pa_idx;
  vfloat4 offset [4];
  vfloat4 endpnt0f [4];
  vint4 endpnt1 [4];
  vint4 endpnt0 [4];
  bool alpha_hdr;
  bool rgb_hdr;
  vmask4 plane_mask;
  int plane2_component;
  uint max_plane;
  quant_and_transfer_table *qat;
  uint weight_quant_level;
  block_mode *bm;
  partition_info *pi;
  uint partition_count;
  undefined8 in_stack_ffffffffffffec68;
  block_size_descriptor *in_stack_ffffffffffffec70;
  undefined8 in_stack_ffffffffffffec78;
  block_size_descriptor *in_stack_ffffffffffffec80;
  byte local_1134;
  byte bStack_1133;
  uint local_112c;
  vint4 *in_stack_ffffffffffffef78;
  bool *in_stack_ffffffffffffef80;
  bool *in_stack_ffffffffffffef88;
  uint8_t *in_stack_ffffffffffffef90;
  int in_stack_ffffffffffffef98;
  astcenc_profile in_stack_ffffffffffffef9c;
  uint uVar27;
  uint local_1060;
  bool local_1059;
  long local_1058;
  uint local_104c;
  undefined8 local_1048 [8];
  undefined8 auStack_1008 [8];
  undefined8 local_fc8 [8];
  undefined8 local_f88 [10];
  undefined1 local_f38 [16];
  undefined8 local_f28;
  undefined8 uStack_f20;
  ulong local_f18;
  ulong uStack_f10;
  uint local_f08;
  uint local_f04;
  quant_and_transfer_table *local_f00;
  uint local_ef4;
  block_mode *local_ef0;
  partition_info *local_ee8;
  uint local_edc;
  long local_ed8;
  image_block *local_ed0;
  long local_ec8;
  undefined1 local_eb8 [16];
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  float local_e8c;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined1 local_e68 [16];
  undefined8 local_e58;
  undefined8 uStack_e50;
  float local_e3c;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined1 local_e18 [16];
  undefined8 local_e08;
  undefined8 uStack_e00;
  float local_dec;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined1 local_dc8 [16];
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined4 local_d9c;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined1 local_d58 [16];
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined1 local_d28 [16];
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined1 local_cf8 [16];
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined1 local_cc8 [16];
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined1 local_c98 [16];
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined1 local_c68 [16];
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined1 local_c38 [20];
  undefined4 local_c24;
  undefined1 *local_c20;
  float local_c14;
  undefined1 *local_c10;
  float local_c04;
  undefined1 *local_c00;
  float local_bf4;
  undefined1 *local_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  undefined1 *local_af0;
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  undefined1 *local_ad0;
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  undefined1 *local_ab0;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  undefined1 *local_a90;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  undefined1 *local_a70;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  undefined1 *local_a50;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  undefined1 *local_a30;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  float local_a0c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_9ec;
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  float local_9cc;
  undefined4 local_9c8;
  undefined4 uStack_9c4;
  undefined4 uStack_9c0;
  undefined4 uStack_9bc;
  undefined4 local_9ac;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined1 local_988 [16];
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  undefined1 *local_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined1 local_938 [16];
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  undefined1 *local_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined1 local_8e8 [16];
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  undefined1 *local_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 *local_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined1 local_7c8 [16];
  undefined1 local_7b8 [16];
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined1 *local_790;
  uint local_784;
  undefined1 *local_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined1 local_758 [16];
  undefined1 local_748 [16];
  undefined1 *local_730;
  ulong local_728;
  ulong uStack_720;
  ulong local_718;
  ulong uStack_710;
  undefined8 local_708;
  ulong uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [16];
  undefined1 *local_6c0;
  undefined8 local_6a8;
  vint4 *in_stack_fffffffffffff960;
  undefined1 local_678 [16];
  undefined1 local_668 [16];
  undefined1 *local_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  undefined1 *local_610;
  ulong local_608;
  ulong uStack_600;
  undefined1 local_5f8 [16];
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  ulong local_5c8;
  ulong uStack_5c0;
  undefined1 *local_5b0;
  ulong local_5a8;
  ulong uStack_5a0;
  undefined1 local_598 [16];
  undefined1 *local_580;
  ulong local_578;
  ulong uStack_570;
  undefined1 local_568 [16];
  undefined4 local_54c;
  undefined4 local_548;
  undefined4 local_544;
  undefined4 local_540;
  undefined4 local_53c;
  undefined1 local_538 [16];
  undefined4 local_51c;
  undefined4 local_518;
  undefined4 local_514;
  undefined4 local_510;
  uint local_50c;
  undefined1 local_508 [16];
  uint local_4f8;
  uint local_4f4;
  uint local_4f0;
  uint local_4ec;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  ulong local_4c8;
  ulong uStack_4c0;
  ulong local_4b8;
  ulong uStack_4b0;
  ulong local_4a8;
  ulong uStack_4a0;
  undefined8 local_498;
  ulong uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined1 local_478 [16];
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  ulong local_448;
  ulong uStack_440;
  ulong local_438;
  ulong uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  ulong local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  ulong local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined1 local_378 [16];
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 *local_330;
  undefined1 local_328 [16];
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  ulong local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  ulong local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined1 local_218 [16];
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 *local_1d0;
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ulong local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 *local_70;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined1 local_18 [16];
  
  local_edc = (uint)*(byte *)(in_RCX + 1);
  local_ed8 = in_RCX;
  local_ed0 = in_RDX;
  local_ec8 = in_RSI;
  local_ee8 = block_size_descriptor::get_partition_info
                        (in_stack_ffffffffffffec80,(uint)((ulong)in_stack_ffffffffffffec78 >> 0x20),
                         (uint)in_stack_ffffffffffffec78);
  local_ef0 = block_size_descriptor::get_block_mode
                        (in_stack_ffffffffffffec70,(uint)((ulong)in_stack_ffffffffffffec68 >> 0x20))
  ;
  local_ef4 = (uint)local_ef0->quant_mode;
  local_f00 = quant_and_xfer_tables + (uint)local_ef0->quant_mode;
  local_f04 = (byte)local_ef0->field_0x5 & 1;
  local_f08 = (uint)*(char *)(local_ed8 + 3);
  local_540 = 3;
  local_544 = 2;
  local_548 = 1;
  local_54c = 0;
  auVar4 = vpinsrd_avx(ZEXT416(0),1,1);
  auVar4 = vpinsrd_avx(auVar4,2,2);
  local_568 = vpinsrd_avx(auVar4,3,3);
  auVar11 = local_568;
  local_790 = local_7b8;
  local_7a8 = local_568._0_8_;
  uStack_7a0 = local_568._8_8_;
  local_f28 = local_568._0_8_;
  uStack_f20 = local_568._8_8_;
  local_780 = local_f38;
  local_784 = local_f08;
  local_50c = local_f08;
  local_4ec = local_f08;
  local_4f0 = local_f08;
  local_4f4 = local_f08;
  local_4f8 = local_f08;
  auVar4 = vpinsrd_avx(ZEXT416(local_f08),local_f08,1);
  auVar4 = vpinsrd_avx(auVar4,local_f08,2);
  local_508 = vpinsrd_avx(auVar4,local_f08,3);
  auVar21 = local_508;
  local_7d8 = local_568._0_8_;
  uStack_7d0 = local_568._8_8_;
  local_7e8 = local_508._0_8_;
  uStack_7e0 = local_508._8_8_;
  local_5d8 = local_568._0_8_;
  uStack_5d0 = local_568._8_8_;
  local_5e8 = local_508._0_8_;
  uStack_5e0 = local_508._8_8_;
  local_598 = vpcmpeqd_avx(local_568,local_508);
  local_580 = local_7c8;
  auVar4 = local_598;
  local_578 = local_598._0_8_;
  uStack_570 = local_598._8_8_;
  local_f18 = local_598._0_8_;
  uStack_f10 = local_598._8_8_;
  local_598 = auVar4;
  local_568 = auVar11;
  local_508 = auVar21;
  if (local_edc == 0) {
    __assert_fail("partition_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                  ,0x60,
                  "bool realign_weights_undecimated(astcenc_profile, const block_size_descriptor &, const image_block &, symbolic_compressed_block &)"
                 );
  }
  for (local_104c = 0; local_104c < local_edc; local_104c = local_104c + 1) {
    unpack_color_endpoints
              (in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,
               in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,in_stack_ffffffffffffef78,
               in_stack_fffffffffffff960);
  }
  local_1058 = local_ed8 + 0x40;
  local_1059 = false;
  local_1060 = 0;
  while( true ) {
    if (local_f04 < local_1060) {
      return local_1059;
    }
    for (uVar27 = 0; uVar27 < local_edc; uVar27 = uVar27 + 1) {
      local_768 = local_fc8[(ulong)uVar27 * 2];
      uStack_760 = local_fc8[(ulong)uVar27 * 2 + 1];
      local_778 = local_f88[(ulong)uVar27 * 2];
      uStack_770 = local_f88[(ulong)uVar27 * 2 + 1];
      local_4d8 = local_768;
      uStack_4d0 = uStack_760;
      local_4e8 = local_778;
      uStack_4e0 = uStack_770;
      auVar11._8_8_ = uStack_760;
      auVar11._0_8_ = local_768;
      auVar4._8_8_ = uStack_770;
      auVar4._0_8_ = local_778;
      local_748 = vpsubd_avx(auVar11,auVar4);
      local_730 = local_758;
      auVar11 = local_748;
      local_478 = ZEXT816(0) << 0x20;
      auVar9 = local_478;
      local_478._8_8_ = SUB168(ZEXT816(0),4);
      local_6a8 = 0;
      local_6a8 = 0;
      local_6f8 = local_748._0_8_;
      uStack_6f0 = local_748._8_8_;
      local_708 = 0;
      uStack_700 = local_478._8_8_;
      local_718 = local_f18;
      uStack_710 = uStack_f10;
      local_4b8 = local_f18;
      uStack_4b0 = uStack_f10;
      local_728 = local_f18;
      uStack_720 = uStack_f10;
      local_488 = local_748._0_8_;
      uStack_480 = local_748._8_8_;
      local_498 = 0;
      uStack_490 = local_478._8_8_;
      local_4a8 = local_f18;
      uStack_4a0 = uStack_f10;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_478._8_8_;
      auVar21._8_8_ = uStack_f10;
      auVar21._0_8_ = local_f18;
      auVar4 = vpblendvb_avx(local_748,auVar19 << 0x40,auVar21);
      local_6c0 = local_6e8;
      local_6d8 = auVar4;
      auVar4 = local_6d8;
      local_6d8._0_8_ = auVar4._0_8_;
      uVar5 = local_6d8._0_8_;
      local_6d8._8_8_ = auVar4._8_8_;
      uVar6 = local_6d8._8_8_;
      local_648 = local_f88[(ulong)uVar27 * 2];
      uStack_640 = local_f88[(ulong)uVar27 * 2 + 1];
      local_468 = local_648;
      uStack_460 = uStack_640;
      auVar12._8_8_ = uStack_640;
      auVar12._0_8_ = local_648;
      local_628 = vcvtdq2ps_avx(auVar12);
      local_610 = local_638;
      auVar21 = local_628;
      uVar7 = local_628._8_8_;
      local_748 = auVar11;
      local_6d8 = auVar4;
      local_478 = auVar9;
      auStack_1008[(ulong)uVar27 * 2] = local_628._0_8_;
      local_628 = auVar21;
      auStack_1008[(ulong)uVar27 * 2 + 1] = uVar7;
      local_458 = uVar5;
      uStack_450 = uVar6;
      local_668 = vcvtdq2ps_avx(auVar4);
      local_650 = local_678;
      auVar4 = local_668;
      local_d98 = local_668._0_8_;
      uStack_d90 = local_668._8_8_;
      local_d9c = 0x3c800000;
      local_db8 = local_668._0_8_;
      uStack_db0 = local_668._8_8_;
      local_c20 = local_dc8;
      local_c24 = 0x3c800000;
      local_9ac = 0x3c800000;
      local_9c8 = 0x3c800000;
      uStack_9c4 = 0x3c800000;
      uStack_9c0 = 0x3c800000;
      uStack_9bc = 0x3c800000;
      local_d68 = local_668._0_8_;
      uStack_d60 = local_668._8_8_;
      local_d78 = 0x3c8000003c800000;
      uStack_d70 = 0x3c8000003c800000;
      local_b18 = local_668._0_8_;
      uVar6 = local_b18;
      uStack_b10 = local_668._8_8_;
      uVar7 = uStack_b10;
      local_b28 = 0x3c8000003c800000;
      uStack_b20 = 0x3c8000003c800000;
      local_b18._0_4_ = local_668._0_4_;
      local_b18._4_4_ = local_668._4_4_;
      uStack_b10._0_4_ = local_668._8_4_;
      uStack_b10._4_4_ = local_668._12_4_;
      local_a30 = local_d58;
      local_a48 = (float)local_b18 * 0.015625;
      fStack_a44 = local_b18._4_4_ * 0.015625;
      fStack_a40 = (float)uStack_b10 * 0.015625;
      fStack_a3c = uStack_b10._4_4_ * 0.015625;
      local_d88 = CONCAT44(local_b18._4_4_ * 0.015625,(float)local_b18 * 0.015625);
      uVar5 = CONCAT44(uStack_b10._4_4_ * 0.015625,(float)uStack_b10 * 0.015625);
      uStack_d80 = uVar5;
      local_b18 = uVar6;
      uStack_b10 = uVar7;
      local_668 = auVar4;
      local_1048[(ulong)uVar27 * 2] = local_d88;
      local_1048[(ulong)uVar27 * 2 + 1] = uVar5;
    }
    if (*(char *)(local_ec8 + 3) == '\0') break;
    for (local_112c = 0; local_112c < *(byte *)(local_ec8 + 3); local_112c = local_112c + 1) {
      uVar27 = (uint)*(byte *)(local_1058 + (ulong)local_112c);
      local_1134 = (byte)local_f00->prev_next_values[(int)uVar27];
      bStack_1133 = (byte)(local_f00->prev_next_values[(int)uVar27] >> 8);
      local_dec = (float)uVar27;
      fVar23 = (float)(int)(local_1134 - uVar27);
      fVar24 = (float)(int)(bStack_1133 - uVar27);
      uVar22 = (uint)local_ee8->partition_of_texel[local_112c];
      uVar5 = local_1048[(ulong)uVar22 * 2];
      uVar6 = local_1048[(ulong)uVar22 * 2 + 1];
      local_8f8 = auStack_1008[(ulong)uVar22 * 2];
      uStack_8f0 = auStack_1008[(ulong)uVar22 * 2 + 1];
      local_c10 = local_e18;
      local_d48 = CONCAT44(local_dec,local_dec);
      uStack_d40 = CONCAT44(local_dec,local_dec);
      local_b38._0_4_ = (float)uVar5;
      fVar1 = (float)local_b38;
      local_b38._4_4_ = (float)((ulong)uVar5 >> 0x20);
      fVar2 = local_b38._4_4_;
      uStack_b30._0_4_ = (float)uVar6;
      fVar3 = (float)uStack_b30;
      uStack_b30._4_4_ = (float)((ulong)uVar6 >> 0x20);
      fVar20 = uStack_b30._4_4_;
      local_a68 = (float)local_b38 * local_dec;
      fStack_a64 = local_b38._4_4_ * local_dec;
      fStack_a60 = (float)uStack_b30 * local_dec;
      fStack_a5c = uStack_b30._4_4_ * local_dec;
      local_a50 = local_d28;
      local_dd8 = CONCAT44(fStack_a64,local_a68);
      uStack_dd0 = CONCAT44(fStack_a5c,fStack_a60);
      local_8a8._0_4_ = (float)local_8f8;
      local_8a8._4_4_ = (float)((ulong)local_8f8 >> 0x20);
      uStack_8a0._0_4_ = (float)uStack_8f0;
      uStack_8a0._4_4_ = (float)((ulong)uStack_8f0 >> 0x20);
      local_8d8 = (float)local_8a8 + local_a68;
      fStack_8d4 = local_8a8._4_4_ + fStack_a64;
      fStack_8d0 = (float)uStack_8a0 + fStack_a60;
      fStack_8cc = uStack_8a0._4_4_ + fStack_a5c;
      local_8c0 = local_8e8;
      uVar7 = CONCAT44(fStack_8d4,local_8d8);
      uVar8 = CONCAT44(fStack_8cc,fStack_8d0);
      uVar25 = uVar8;
      local_e08 = uVar5;
      uStack_e00 = uVar6;
      local_de8 = uVar5;
      uStack_de0 = uVar6;
      local_d38 = uVar5;
      uStack_d30 = uVar6;
      local_c14 = local_dec;
      local_b48 = local_d48;
      uStack_b40 = uStack_d40;
      local_b38 = uVar5;
      uStack_b30 = uVar6;
      local_9e8 = local_dec;
      fStack_9e4 = local_dec;
      fStack_9e0 = local_dec;
      fStack_9dc = local_dec;
      local_9cc = local_dec;
      local_908 = local_dd8;
      uStack_900 = uStack_dd0;
      local_8b8 = local_dd8;
      uStack_8b0 = uStack_dd0;
      local_8a8 = local_8f8;
      uStack_8a0 = uStack_8f0;
      vVar26 = image_block::texel(local_ed0,local_112c);
      local_858 = vVar26.m._0_8_;
      local_128 = *(undefined8 *)(local_ed0->channel_weight).m;
      uStack_120 = *(undefined8 *)((local_ed0->channel_weight).m + 2);
      local_848 = uVar7;
      uStack_840 = uVar8;
      uStack_850 = uVar25;
      local_7f8 = uVar7;
      uStack_7f0 = uVar8;
      local_808 = local_858;
      uStack_800 = uVar25;
      auVar10._8_8_ = uVar8;
      auVar10._0_8_ = uVar7;
      auVar9._8_8_ = uVar25;
      auVar9._0_8_ = local_858;
      local_828 = vsubps_avx(auVar10,auVar9);
      local_810 = local_838;
      auVar4 = local_828;
      local_e38 = uVar5;
      uStack_e30 = uVar6;
      local_e3c = fVar23;
      local_e58 = uVar5;
      uStack_e50 = uVar6;
      local_c00 = local_e68;
      local_c04 = fVar23;
      local_9ec = fVar23;
      local_a08 = fVar23;
      fStack_a04 = fVar23;
      fStack_a00 = fVar23;
      fStack_9fc = fVar23;
      local_d08 = uVar5;
      uStack_d00 = uVar6;
      local_d18 = CONCAT44(fVar23,fVar23);
      uStack_d10 = CONCAT44(fVar23,fVar23);
      local_b58 = uVar5;
      uStack_b50 = uVar6;
      local_b68 = CONCAT44(fVar23,fVar23);
      uStack_b60 = CONCAT44(fVar23,fVar23);
      local_a88 = fVar1 * fVar23;
      fStack_a84 = fVar2 * fVar23;
      fStack_a80 = fVar3 * fVar23;
      fStack_a7c = fVar20 * fVar23;
      local_a70 = local_cf8;
      local_e28 = CONCAT44(fStack_a84,local_a88);
      uStack_e20 = CONCAT44(fStack_a7c,fStack_a80);
      local_948 = local_828._0_8_;
      uStack_940 = local_828._8_8_;
      local_958 = local_e28;
      uStack_950 = uStack_e20;
      local_888 = local_828._0_8_;
      uVar7 = local_888;
      uStack_880 = local_828._8_8_;
      uVar8 = uStack_880;
      local_898 = local_e28;
      uStack_890 = uStack_e20;
      local_888._0_4_ = local_828._0_4_;
      local_888._4_4_ = local_828._4_4_;
      uStack_880._0_4_ = local_828._8_4_;
      uStack_880._4_4_ = local_828._12_4_;
      local_928 = (float)local_888 + local_a88;
      fStack_924 = local_888._4_4_ + fStack_a84;
      fStack_920 = (float)uStack_880 + fStack_a80;
      fStack_91c = uStack_880._4_4_ + fStack_a7c;
      local_910 = local_938;
      local_c78 = CONCAT44(fStack_924,local_928);
      uStack_c70 = CONCAT44(fStack_91c,fStack_920);
      local_e88 = uVar5;
      uStack_e80 = uVar6;
      local_e8c = fVar24;
      local_ea8 = uVar5;
      uStack_ea0 = uVar6;
      local_bf0 = local_eb8;
      local_bf4 = fVar24;
      local_a0c = fVar24;
      local_a28 = fVar24;
      fStack_a24 = fVar24;
      fStack_a20 = fVar24;
      fStack_a1c = fVar24;
      local_cd8 = uVar5;
      uStack_cd0 = uVar6;
      local_ce8 = CONCAT44(fVar24,fVar24);
      uStack_ce0 = CONCAT44(fVar24,fVar24);
      local_b78 = uVar5;
      uStack_b70 = uVar6;
      local_b88 = CONCAT44(fVar24,fVar24);
      uStack_b80 = CONCAT44(fVar24,fVar24);
      local_aa8 = fVar1 * fVar24;
      fStack_aa4 = fVar2 * fVar24;
      fStack_aa0 = fVar3 * fVar24;
      fStack_a9c = fVar20 * fVar24;
      local_a90 = local_cc8;
      local_e78 = CONCAT44(fStack_aa4,local_aa8);
      uStack_e70 = CONCAT44(fStack_a9c,fStack_aa0);
      local_998 = local_828._0_8_;
      uStack_990 = local_828._8_8_;
      local_9a8 = local_e78;
      uStack_9a0 = uStack_e70;
      local_868 = local_828._0_8_;
      uStack_860 = local_828._8_8_;
      local_878 = local_e78;
      uStack_870 = uStack_e70;
      local_978 = (float)local_888 + local_aa8;
      fStack_974 = local_888._4_4_ + fStack_aa4;
      fStack_970 = (float)uStack_880 + fStack_aa0;
      fStack_96c = uStack_880._4_4_ + fStack_a9c;
      local_960 = local_988;
      local_ca8 = CONCAT44(fStack_974,local_978);
      uStack_ca0 = CONCAT44(fStack_96c,fStack_970);
      local_c48 = local_828._0_8_;
      uStack_c40 = local_828._8_8_;
      local_c58 = local_828._0_8_;
      uStack_c50 = local_828._8_8_;
      local_bd8 = local_828._0_8_;
      uStack_bd0 = local_828._8_8_;
      local_be8 = local_828._0_8_;
      uStack_be0 = local_828._8_8_;
      local_b08 = (float)local_888 * (float)local_888;
      fStack_b04 = local_888._4_4_ * local_888._4_4_;
      fStack_b00 = (float)uStack_880 * (float)uStack_880;
      fStack_afc = uStack_880._4_4_ * uStack_880._4_4_;
      local_af0 = local_c38;
      local_118 = CONCAT44(fStack_b04,local_b08);
      uStack_110 = CONCAT44(fStack_afc,fStack_b00);
      local_148 = local_118;
      uStack_140 = uStack_110;
      local_158 = local_128;
      uStack_150 = uStack_120;
      local_c8 = local_118;
      uStack_c0 = uStack_110;
      local_d8 = local_128;
      uStack_d0 = uStack_120;
      local_98 = local_118;
      uStack_90 = uStack_110;
      local_a8 = local_128;
      uVar5 = local_a8;
      uStack_a0 = uStack_120;
      uVar6 = uStack_a0;
      local_a8._0_4_ = (float)local_128;
      local_a8._4_4_ = (float)((ulong)local_128 >> 0x20);
      uStack_a0._0_4_ = (float)uStack_120;
      uStack_a0._4_4_ = (float)((ulong)uStack_120 >> 0x20);
      local_88 = local_b08 * (float)local_a8;
      fStack_84 = fStack_b04 * local_a8._4_4_;
      local_70 = local_b8;
      fStack_80 = fStack_b00 * (float)uStack_a0;
      fStack_7c = fStack_afc * uStack_a0._4_4_;
      local_138 = CONCAT44(fStack_84,local_88);
      uStack_130 = CONCAT44(fStack_afc * uStack_a0._4_4_,fStack_b00 * (float)uStack_a0);
      local_168 = local_138;
      uStack_160 = uStack_130;
      local_f8 = local_138;
      uStack_f0 = uStack_130;
      local_38 = local_138;
      uStack_30 = uStack_130;
      local_48 = local_138;
      uStack_40 = uStack_130;
      auVar18._8_8_ = uStack_130;
      auVar18._0_8_ = local_138;
      auVar17._8_8_ = uStack_130;
      auVar17._0_8_ = local_138;
      local_68 = vunpckhpd_avx(auVar17,auVar18);
      local_58 = local_138;
      uStack_50 = uStack_130;
      auVar9 = local_68;
      local_28 = fStack_84 + (float)local_68._4_4_;
      fStack_24 = local_28;
      fStack_20 = local_28;
      fStack_1c = local_28;
      fVar1 = local_88 + (float)local_68._0_4_ + local_28;
      local_18 = ZEXT416((uint)fVar1);
      auVar10 = local_18;
      local_18._4_4_ = 0;
      local_18._0_4_ = fVar1;
      local_108 = local_18._0_8_;
      uStack_100 = 0;
      local_e8 = local_18._0_8_;
      uStack_e0 = 0;
      local_c88 = local_c78;
      uStack_c80 = uStack_c70;
      local_bb8 = local_c78;
      uStack_bb0 = uStack_c70;
      local_bc8 = local_c78;
      uStack_bc0 = uStack_c70;
      local_ae8 = local_928 * local_928;
      fStack_ae4 = fStack_924 * fStack_924;
      fStack_ae0 = fStack_920 * fStack_920;
      fStack_adc = fStack_91c * fStack_91c;
      local_ad0 = local_c68;
      local_278 = CONCAT44(fStack_ae4,local_ae8);
      uStack_270 = CONCAT44(fStack_adc,fStack_ae0);
      local_288 = local_128;
      uStack_280 = uStack_120;
      local_2a8 = local_278;
      uStack_2a0 = uStack_270;
      local_2b8 = local_128;
      uStack_2b0 = uStack_120;
      local_228 = local_278;
      uStack_220 = uStack_270;
      local_238 = local_128;
      uStack_230 = uStack_120;
      local_1f8 = local_278;
      uStack_1f0 = uStack_270;
      local_208 = local_128;
      uStack_200 = uStack_120;
      local_1e8 = local_ae8 * (float)local_a8;
      fStack_1e4 = fStack_ae4 * local_a8._4_4_;
      local_1d0 = local_218;
      fStack_1e0 = fStack_ae0 * (float)uStack_a0;
      fStack_1dc = fStack_adc * uStack_a0._4_4_;
      local_298 = CONCAT44(fStack_1e4,local_1e8);
      uStack_290 = CONCAT44(fStack_adc * uStack_a0._4_4_,fStack_ae0 * (float)uStack_a0);
      local_2c8 = local_298;
      uStack_2c0 = uStack_290;
      local_258 = local_298;
      uStack_250 = uStack_290;
      local_198 = local_298;
      uStack_190 = uStack_290;
      local_1a8 = local_298;
      uStack_1a0 = uStack_290;
      auVar16._8_8_ = uStack_290;
      auVar16._0_8_ = local_298;
      auVar15._8_8_ = uStack_290;
      auVar15._0_8_ = local_298;
      local_1c8 = vunpckhpd_avx(auVar15,auVar16);
      local_1b8 = local_298;
      uStack_1b0 = uStack_290;
      auVar12 = local_1c8;
      local_188 = fStack_1e4 + (float)local_1c8._4_4_;
      fStack_184 = local_188;
      fStack_180 = local_188;
      fStack_17c = local_188;
      fVar2 = local_1e8 + (float)local_1c8._0_4_ + local_188;
      local_178 = ZEXT416((uint)fVar2);
      auVar19 = local_178;
      local_178._4_4_ = 0;
      local_178._0_4_ = fVar2;
      local_268 = local_178._0_8_;
      uStack_260 = 0;
      local_248 = local_178._0_8_;
      uStack_240 = 0;
      local_cb8 = local_ca8;
      uStack_cb0 = uStack_ca0;
      local_b98 = local_ca8;
      uStack_b90 = uStack_ca0;
      local_ba8 = local_ca8;
      uStack_ba0 = uStack_ca0;
      local_ac8 = local_978 * local_978;
      fStack_ac4 = fStack_974 * fStack_974;
      fStack_ac0 = fStack_970 * fStack_970;
      fStack_abc = fStack_96c * fStack_96c;
      local_ab0 = local_c98;
      local_3d8 = CONCAT44(fStack_ac4,local_ac8);
      uStack_3d0 = CONCAT44(fStack_abc,fStack_ac0);
      local_3e8 = local_128;
      uStack_3e0 = uStack_120;
      local_408 = local_3d8;
      uStack_400 = uStack_3d0;
      local_418 = local_128;
      uStack_410 = uStack_120;
      local_388 = local_3d8;
      uStack_380 = uStack_3d0;
      local_398 = local_128;
      uStack_390 = uStack_120;
      local_358 = local_3d8;
      uStack_350 = uStack_3d0;
      local_368 = local_128;
      uStack_360 = uStack_120;
      local_348 = local_ac8 * (float)local_a8;
      fStack_344 = fStack_ac4 * local_a8._4_4_;
      local_330 = local_378;
      fStack_340 = fStack_ac0 * (float)uStack_a0;
      fStack_33c = fStack_abc * uStack_a0._4_4_;
      local_3f8 = CONCAT44(fStack_344,local_348);
      uStack_3f0 = CONCAT44(fStack_abc * uStack_a0._4_4_,fStack_ac0 * (float)uStack_a0);
      local_428 = local_3f8;
      uStack_420 = uStack_3f0;
      local_3b8 = local_3f8;
      uStack_3b0 = uStack_3f0;
      local_2f8 = local_3f8;
      uStack_2f0 = uStack_3f0;
      local_308 = local_3f8;
      uStack_300 = uStack_3f0;
      auVar14._8_8_ = uStack_3f0;
      auVar14._0_8_ = local_3f8;
      auVar13._8_8_ = uStack_3f0;
      auVar13._0_8_ = local_3f8;
      local_328 = vunpckhpd_avx(auVar13,auVar14);
      local_318 = local_3f8;
      uStack_310 = uStack_3f0;
      auVar11 = local_328;
      local_2e8 = fStack_344 + (float)local_328._4_4_;
      fStack_2e4 = local_2e8;
      fStack_2e0 = local_2e8;
      fStack_2dc = local_2e8;
      fVar3 = local_348 + (float)local_328._0_4_ + local_2e8;
      local_2d8 = ZEXT416((uint)fVar3);
      auVar21 = local_2d8;
      local_2d8._4_4_ = 0;
      local_2d8._0_4_ = fVar3;
      local_3c8 = local_2d8._0_8_;
      uStack_3c0 = 0;
      local_3a8 = local_2d8._0_8_;
      uStack_3a0 = 0;
      if (((fVar1 <= fVar3) || (fVar2 <= fVar3)) || (0x3f < uVar27)) {
        if ((fVar2 < fVar1) && (uVar27 != 0)) {
          *(byte *)(local_1058 + (ulong)local_112c) = local_1134;
          local_1059 = true;
        }
      }
      else {
        *(byte *)(local_1058 + (ulong)local_112c) = bStack_1133;
        local_1059 = true;
      }
      local_888 = uVar7;
      uStack_880 = uVar8;
      local_828 = auVar4;
      local_328 = auVar11;
      local_2d8 = auVar21;
      local_1c8 = auVar12;
      local_178 = auVar19;
      local_a8 = uVar5;
      uStack_a0 = uVar6;
      local_68 = auVar9;
      local_18 = auVar10;
    }
    local_1058 = local_1058 + 0x20;
    local_608 = local_f18;
    uStack_600 = uStack_f10;
    local_4c8 = local_f18;
    uStack_4c0 = uStack_f10;
    local_53c = 0xffffffff;
    local_510 = 0xffffffff;
    local_514 = 0xffffffff;
    local_518 = 0xffffffff;
    local_51c = 0xffffffff;
    auVar4 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
    auVar4 = vpinsrd_avx(auVar4,0xffffffff,2);
    local_538 = vpinsrd_avx(auVar4,0xffffffff,3);
    auVar4 = local_538;
    local_438 = local_f18;
    uStack_430 = uStack_f10;
    local_448 = local_538._0_8_;
    uStack_440 = local_538._8_8_;
    local_5c8 = local_f18 ^ local_538._0_8_;
    uStack_5c0 = uStack_f10 ^ local_538._8_8_;
    local_5b0 = local_5f8;
    local_5a8 = local_5c8;
    uStack_5a0 = uStack_5c0;
    local_f18 = local_5c8;
    uStack_f10 = uStack_5c0;
    local_1060 = local_1060 + 1;
    local_538 = auVar4;
  }
  __assert_fail("bsd.texel_count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                ,0x7d,
                "bool realign_weights_undecimated(astcenc_profile, const block_size_descriptor &, const image_block &, symbolic_compressed_block &)"
               );
}

Assistant:

static bool realign_weights_undecimated(
	astcenc_profile decode_mode,
	const block_size_descriptor& bsd,
	const image_block& blk,
	symbolic_compressed_block& scb
) {
	// Get the partition descriptor
	unsigned int partition_count = scb.partition_count;
	const auto& pi = bsd.get_partition_info(partition_count, scb.partition_index);

	// Get the quantization table
	const block_mode& bm = bsd.get_block_mode(scb.block_mode);
	unsigned int weight_quant_level = bm.quant_mode;
	const quant_and_transfer_table& qat = quant_and_xfer_tables[weight_quant_level];

	unsigned int max_plane = bm.is_dual_plane;
	int plane2_component = scb.plane2_component;
	vmask4 plane_mask = vint4::lane_id() == vint4(plane2_component);

	// Decode the color endpoints
	bool rgb_hdr;
	bool alpha_hdr;
	vint4 endpnt0[BLOCK_MAX_PARTITIONS];
	vint4 endpnt1[BLOCK_MAX_PARTITIONS];
	vfloat4 endpnt0f[BLOCK_MAX_PARTITIONS];
	vfloat4 offset[BLOCK_MAX_PARTITIONS];

	promise(partition_count > 0);

	for (unsigned int pa_idx = 0; pa_idx < partition_count; pa_idx++)
	{
		unpack_color_endpoints(decode_mode,
		                       scb.color_formats[pa_idx],
		                       scb.color_values[pa_idx],
		                       rgb_hdr, alpha_hdr,
		                       endpnt0[pa_idx],
		                       endpnt1[pa_idx]);
	}

	uint8_t* dec_weights_uquant = scb.weights;
	bool adjustments = false;

	// For each plane and partition ...
	for (unsigned int pl_idx = 0; pl_idx <= max_plane; pl_idx++)
	{
		for (unsigned int pa_idx = 0; pa_idx < partition_count; pa_idx++)
		{
			// Compute the endpoint delta for all components in current plane
			vint4 epd = endpnt1[pa_idx] - endpnt0[pa_idx];
			epd = select(epd, vint4::zero(), plane_mask);

			endpnt0f[pa_idx] = int_to_float(endpnt0[pa_idx]);
			offset[pa_idx] = int_to_float(epd) * (1.0f / 64.0f);
		}

		// For each weight compute previous, current, and next errors
		promise(bsd.texel_count > 0);
		for (unsigned int texel = 0; texel < bsd.texel_count; texel++)
		{
			int uqw = dec_weights_uquant[texel];

			uint32_t prev_and_next = qat.prev_next_values[uqw];
			int uqw_down = prev_and_next & 0xFF;
			int uqw_up = (prev_and_next >> 8) & 0xFF;

			// Interpolate the colors to create the diffs
			float weight_base = static_cast<float>(uqw);
			float weight_down = static_cast<float>(uqw_down - uqw);
			float weight_up = static_cast<float>(uqw_up - uqw);

			unsigned int partition = pi.partition_of_texel[texel];
			vfloat4 color_offset = offset[partition];
			vfloat4 color_base   = endpnt0f[partition];

			vfloat4 color = color_base + color_offset * weight_base;
			vfloat4 orig_color   = blk.texel(texel);
			vfloat4 error_weight = blk.channel_weight;

			vfloat4 color_diff      = color - orig_color;
			vfloat4 color_diff_down = color_diff + color_offset * weight_down;
			vfloat4 color_diff_up   = color_diff + color_offset * weight_up;

			float error_base = dot_s(color_diff      * color_diff,      error_weight);
			float error_down = dot_s(color_diff_down * color_diff_down, error_weight);
			float error_up   = dot_s(color_diff_up   * color_diff_up,   error_weight);

			// Check if the prev or next error is better, and if so use it
			if ((error_up < error_base) && (error_up < error_down) && (uqw < 64))
			{
				dec_weights_uquant[texel] = static_cast<uint8_t>(uqw_up);
				adjustments = true;
			}
			else if ((error_down < error_base) && (uqw > 0))
			{
				dec_weights_uquant[texel] = static_cast<uint8_t>(uqw_down);
				adjustments = true;
			}
		}

		// Prepare iteration for plane 2
		dec_weights_uquant += WEIGHTS_PLANE2_OFFSET;
		plane_mask = ~plane_mask;
	}

	return adjustments;
}